

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O2

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiNode *pNode)

{
  char *pcVar1;
  ulong __n;
  uint i;
  char *pcVar2;
  ValidateDSProcess *pVVar3;
  uint uVar4;
  ulong uVar5;
  reference rVar6;
  vector<bool,_std::allocator<bool>_> abHadMesh;
  ValidateDSProcess local_50;
  undefined8 local_30;
  
  if (pNode == (aiNode *)0x0) {
    ReportError(this,"A node of the scenegraph is NULL");
  }
  pVVar3 = this;
  Validate(this,&pNode->mName);
  pcVar1 = (pNode->mName).data;
  if ((this->mScene->mRootNode != pNode) && (pNode->mParent == (aiNode *)0x0)) {
    ReportError(pVVar3,"Non-root node %s lacks a valid parent (aiNode::mParent is NULL) ",pcVar1);
  }
  if (pNode->mNumMeshes != 0) {
    if (pNode->mMeshes == (uint *)0x0) {
      pcVar2 = "aiNode::mMeshes is NULL for node %s (aiNode::mNumMeshes is %i)";
      goto LAB_0031d9eb;
    }
    pVVar3 = &local_50;
    local_50.super_BaseProcess._vptr_BaseProcess = (_func_int **)0x0;
    local_50.super_BaseProcess.shared._0_4_ = 0;
    local_50.super_BaseProcess.progress = (ProgressHandler *)0x0;
    local_50.mScene._0_4_ = 0;
    local_30 = 0;
    std::vector<bool,_std::allocator<bool>_>::resize
              ((vector<bool,_std::allocator<bool>_> *)pVVar3,(ulong)this->mScene->mNumMeshes,false);
    for (uVar5 = 0; uVar5 < pNode->mNumMeshes; uVar5 = uVar5 + 1) {
      __n = (ulong)pNode->mMeshes[uVar5];
      uVar4 = this->mScene->mNumMeshes;
      if (uVar4 <= pNode->mMeshes[uVar5]) {
        uVar4 = uVar4 - 1;
        pcVar2 = "aiNode::mMeshes[%i] is out of range for node %s (maximum is %i)";
LAB_0031d9b2:
        ReportError(pVVar3,pcVar2,__n,pcVar1,(ulong)uVar4);
      }
      pVVar3 = &local_50;
      rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&local_50,__n);
      if ((*rVar6._M_p & rVar6._M_mask) != 0) {
        uVar4 = pNode->mMeshes[uVar5];
        pcVar2 = "aiNode::mMeshes[%i] is already referenced by this node %s (value: %i)";
        __n = uVar5 & 0xffffffff;
        goto LAB_0031d9b2;
      }
      pVVar3 = &local_50;
      rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&local_50,
                         (ulong)pNode->mMeshes[uVar5]);
      *rVar6._M_p = *rVar6._M_p | rVar6._M_mask;
    }
    pVVar3 = &local_50;
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)pVVar3);
  }
  uVar4 = pNode->mNumChildren;
  if (uVar4 != 0) {
    if (pNode->mChildren == (aiNode **)0x0) {
      pcVar2 = "aiNode::mChildren is NULL for node %s (aiNode::mNumChildren is %i)";
LAB_0031d9eb:
      ReportError(pVVar3,pcVar2,pcVar1);
    }
    for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
      Validate(this,pNode->mChildren[uVar5]);
      uVar4 = pNode->mNumChildren;
    }
  }
  return;
}

Assistant:

void ValidateDSProcess::Validate( const aiNode* pNode)
{
    if (!pNode) {
    	ReportError("A node of the scenegraph is NULL");
    }
    // Validate node name string first so that it's safe to use in below expressions
    this->Validate(&pNode->mName);
    const char* nodeName = (&pNode->mName)->C_Str();
    if (pNode != mScene->mRootNode && !pNode->mParent){
        ReportError("Non-root node %s lacks a valid parent (aiNode::mParent is NULL) ", nodeName);
    }

    // validate all meshes
    if (pNode->mNumMeshes)
    {
        if (!pNode->mMeshes)
        {
            ReportError("aiNode::mMeshes is NULL for node %s (aiNode::mNumMeshes is %i)",
            		  nodeName, pNode->mNumMeshes);
        }
        std::vector<bool> abHadMesh;
        abHadMesh.resize(mScene->mNumMeshes,false);
        for (unsigned int i = 0; i < pNode->mNumMeshes;++i)
        {
            if (pNode->mMeshes[i] >= mScene->mNumMeshes)
            {
                ReportError("aiNode::mMeshes[%i] is out of range for node %s (maximum is %i)",
                    pNode->mMeshes[i], nodeName, mScene->mNumMeshes-1);
            }
            if (abHadMesh[pNode->mMeshes[i]])
            {
                ReportError("aiNode::mMeshes[%i] is already referenced by this node %s (value: %i)",
                    i, nodeName, pNode->mMeshes[i]);
            }
            abHadMesh[pNode->mMeshes[i]] = true;
        }
    }
    if (pNode->mNumChildren)
    {
        if (!pNode->mChildren)  {
            ReportError("aiNode::mChildren is NULL for node %s (aiNode::mNumChildren is %i)",
            		nodeName, pNode->mNumChildren);
        }
        for (unsigned int i = 0; i < pNode->mNumChildren;++i)   {
            Validate(pNode->mChildren[i]);
        }
    }
}